

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::ReturnStmt::toString_abi_cxx11_(string *__return_storage_ptr__,ReturnStmt *this)

{
  ostringstream local_190 [8];
  ostringstream msg;
  ReturnStmt *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"return ");
  ast::operator<<((ostream *)local_190,this->returnValue);
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::ReturnStmt::toString() const {
    std::ostringstream msg;
    msg << "return ";
    msg << returnValue;
    msg << std::endl;
    return msg.str();
}